

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
nlohmann::json_abi_v3_11_3::detail::
binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
::get_msgpack_object
          (binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
           *this,size_t len)

{
  byte bVar1;
  ulong in_RSI;
  long in_RDI;
  size_t i;
  string_t key;
  string_t *in_stack_000000a0;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_000000a8;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_000001d8;
  undefined4 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa4;
  byte in_stack_ffffffffffffffa5;
  byte in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  ulong local_40;
  string local_38 [32];
  ulong local_18;
  byte local_1;
  
  local_18 = in_RSI;
  bVar1 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x38))(*(long **)(in_RDI + 0x28),in_RSI);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    std::__cxx11::string::string(local_38);
    for (local_40 = 0; local_40 < local_18; local_40 = local_40 + 1) {
      get((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
           *)CONCAT17(in_stack_ffffffffffffffa7,
                      CONCAT16(in_stack_ffffffffffffffa6,
                               CONCAT15(in_stack_ffffffffffffffa5,
                                        CONCAT14(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0
                                                )))));
      in_stack_ffffffffffffffa7 = get_msgpack_string(in_stack_000000a8,in_stack_000000a0);
      in_stack_ffffffffffffffa6 = 1;
      if ((bool)in_stack_ffffffffffffffa7) {
        in_stack_ffffffffffffffa5 =
             (**(code **)(**(long **)(in_RDI + 0x28) + 0x40))(*(long **)(in_RDI + 0x28),local_38);
        in_stack_ffffffffffffffa6 = in_stack_ffffffffffffffa5 ^ 0xff;
      }
      if ((in_stack_ffffffffffffffa6 & 1) != 0) {
        local_1 = 0;
        goto LAB_0028d89c;
      }
      in_stack_ffffffffffffffa4 = parse_msgpack_internal(in_stack_000001d8);
      if (((in_stack_ffffffffffffffa4 ^ 0xff) & 1) != 0) {
        local_1 = 0;
        goto LAB_0028d89c;
      }
      std::__cxx11::string::clear();
    }
    local_1 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x48))();
    local_1 = local_1 & 1;
LAB_0028d89c:
    std::__cxx11::string::~string(local_38);
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool get_msgpack_object(const std::size_t len)
    {
        if (JSON_HEDLEY_UNLIKELY(!sax->start_object(len)))
        {
            return false;
        }

        string_t key;
        for (std::size_t i = 0; i < len; ++i)
        {
            get();
            if (JSON_HEDLEY_UNLIKELY(!get_msgpack_string(key) || !sax->key(key)))
            {
                return false;
            }

            if (JSON_HEDLEY_UNLIKELY(!parse_msgpack_internal()))
            {
                return false;
            }
            key.clear();
        }

        return sax->end_object();
    }